

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_hash.cpp
# Opt level: O1

void duckdb::TemplatedLoopCombineHash<false,int>
               (Vector *input,Vector *hashes,SelectionVector *rsel,idx_t count)

{
  unsigned_long *puVar1;
  data_ptr_t pdVar2;
  sel_t *psVar3;
  ulong uVar4;
  idx_t ridx_1;
  idx_t iVar5;
  idx_t ridx_2;
  idx_t ridx;
  idx_t iVar6;
  ulong uVar7;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_68;
  
  if ((input->vector_type == CONSTANT_VECTOR) && (hashes->vector_type == CONSTANT_VECTOR)) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      uVar4 = (ulong)*(uint *)input->data * -0x2917014799a6026d;
      uVar4 = (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
      uVar4 = uVar4 >> 0x20 ^ uVar4;
    }
    else {
      uVar4 = 0xbf58476d1ce4e5b9;
    }
    uVar7 = *(ulong *)hashes->data;
    *(ulong *)hashes->data = (uVar7 >> 0x20 ^ uVar7) * -0x2917014799a6026d ^ uVar4;
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_68);
    Vector::ToUnifiedFormat(input,count,&local_68);
    if (hashes->vector_type == CONSTANT_VECTOR) {
      uVar4 = *(ulong *)hashes->data;
      Vector::SetVectorType(hashes,FLAT_VECTOR);
      pdVar2 = hashes->data;
      if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar3 = (local_68.sel)->sel_vector;
          iVar6 = 0;
          do {
            iVar5 = iVar6;
            if (psVar3 != (sel_t *)0x0) {
              iVar5 = (idx_t)psVar3[iVar6];
            }
            uVar7 = ((ulong)*(uint *)(local_68.data + iVar5 * 4) * -0x2917014799a6026d >> 0x20 ^
                    (ulong)*(uint *)(local_68.data + iVar5 * 4) * -0x2917014799a6026d) *
                    -0x2917014799a6026d;
            *(ulong *)(pdVar2 + iVar6 * 8) =
                 uVar7 >> 0x20 ^ (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d ^ uVar7;
            iVar6 = iVar6 + 1;
          } while (count != iVar6);
        }
      }
      else if (count != 0) {
        psVar3 = (local_68.sel)->sel_vector;
        iVar6 = 0;
        do {
          iVar5 = iVar6;
          if (psVar3 != (sel_t *)0x0) {
            iVar5 = (idx_t)psVar3[iVar6];
          }
          uVar7 = 0xbf58476d1ce4e5b9;
          if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0) {
            uVar7 = ((ulong)*(uint *)(local_68.data + iVar5 * 4) * -0x2917014799a6026d >> 0x20 ^
                    (ulong)*(uint *)(local_68.data + iVar5 * 4) * -0x2917014799a6026d) *
                    -0x2917014799a6026d;
            uVar7 = uVar7 >> 0x20 ^ uVar7;
          }
          *(ulong *)(pdVar2 + iVar6 * 8) = uVar7 ^ (uVar4 >> 0x20 ^ uVar4) * -0x2917014799a6026d;
          iVar6 = iVar6 + 1;
        } while (count != iVar6);
      }
    }
    else {
      pdVar2 = hashes->data;
      if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        if (count != 0) {
          psVar3 = (local_68.sel)->sel_vector;
          iVar6 = 0;
          do {
            iVar5 = iVar6;
            if (psVar3 != (sel_t *)0x0) {
              iVar5 = (idx_t)psVar3[iVar6];
            }
            uVar4 = ((ulong)*(uint *)(local_68.data + iVar5 * 4) * -0x2917014799a6026d >> 0x20 ^
                    (ulong)*(uint *)(local_68.data + iVar5 * 4) * -0x2917014799a6026d) *
                    -0x2917014799a6026d;
            *(ulong *)(pdVar2 + iVar6 * 8) =
                 uVar4 >> 0x20 ^
                 (*(ulong *)(pdVar2 + iVar6 * 8) >> 0x20 ^ *(ulong *)(pdVar2 + iVar6 * 8)) *
                 -0x2917014799a6026d ^ uVar4;
            iVar6 = iVar6 + 1;
          } while (count != iVar6);
        }
      }
      else if (count != 0) {
        psVar3 = (local_68.sel)->sel_vector;
        iVar6 = 0;
        do {
          iVar5 = iVar6;
          if (psVar3 != (sel_t *)0x0) {
            iVar5 = (idx_t)psVar3[iVar6];
          }
          uVar4 = 0xbf58476d1ce4e5b9;
          if ((local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [iVar5 >> 6] >> (iVar5 & 0x3f) & 1) != 0) {
            uVar4 = ((ulong)*(uint *)(local_68.data + iVar5 * 4) * -0x2917014799a6026d >> 0x20 ^
                    (ulong)*(uint *)(local_68.data + iVar5 * 4) * -0x2917014799a6026d) *
                    -0x2917014799a6026d;
            uVar4 = uVar4 >> 0x20 ^ uVar4;
          }
          *(ulong *)(pdVar2 + iVar6 * 8) =
               (*(ulong *)(pdVar2 + iVar6 * 8) >> 0x20 ^ *(ulong *)(pdVar2 + iVar6 * 8)) *
               -0x2917014799a6026d ^ uVar4;
          iVar6 = iVar6 + 1;
        } while (count != iVar6);
      }
    }
    if (local_68.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void TemplatedLoopCombineHash(Vector &input, Vector &hashes, const SelectionVector *rsel, idx_t count) {
	if (input.GetVectorType() == VectorType::CONSTANT_VECTOR && hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
		auto ldata = ConstantVector::GetData<T>(input);
		auto hash_data = ConstantVector::GetData<hash_t>(hashes);

		auto other_hash = HashOp::Operation(*ldata, ConstantVector::IsNull(input));
		*hash_data = CombineHashScalar(*hash_data, other_hash);
	} else {
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);
		if (hashes.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			// mix constant with non-constant, first get the constant value
			auto constant_hash = *ConstantVector::GetData<hash_t>(hashes);
			// now re-initialize the hashes vector to an empty flat vector
			hashes.SetVectorType(VectorType::FLAT_VECTOR);
			TightLoopCombineHashConstant<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata), constant_hash,
			                                          FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                          idata.validity);
		} else {
			D_ASSERT(hashes.GetVectorType() == VectorType::FLAT_VECTOR);
			TightLoopCombineHash<HAS_RSEL, T>(UnifiedVectorFormat::GetData<T>(idata),
			                                  FlatVector::GetData<hash_t>(hashes), rsel, count, idata.sel,
			                                  idata.validity);
		}
	}
}